

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O1

ParsedSchema __thiscall
capnp::SchemaParser::parseDiskFile
          (SchemaParser *this,StringPtr displayName,StringPtr diskPath,
          ArrayPtr<const_kj::StringPtr> importPath)

{
  map<kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
  *pmVar1;
  MutexGuarded<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> *pMVar2;
  undefined1 *puVar3;
  undefined8 *puVar4;
  Impl *pIVar5;
  ReadableDirectory **ppRVar6;
  PathPtr prefix;
  String *pSVar7;
  size_t sVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  Exception *pEVar11;
  bool bVar12;
  int iVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type *pmVar14;
  iterator iVar15;
  Clock *clock;
  InMemoryFileFactory *fileFactory;
  StringPtr *extraout_RDX;
  StringPtr *params;
  _Base_ptr p_Var16;
  size_t sVar17;
  long lVar18;
  Exception *pEVar19;
  void *__arg;
  void *pvVar20;
  _Base_ptr p_Var21;
  _Base_ptr *pp_Var22;
  anon_union_120_1_a8c68091_for_NullableValue<capnp::SchemaParser::DiskFileCompat>_2 *paVar23;
  ArrayPtr<const_char> *this_00;
  Own<kj::Directory,_std::nullptr_t> OVar24;
  pair<std::_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>,_bool>
  pVar25;
  ParsedSchema PVar26;
  ArrayPtr<const_kj::ReadableDirectory_*const> importPath_00;
  Path parsed;
  DebugComparison<std::_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_&,_std::_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
  _kjCondition_1;
  iterator iter;
  StringPtr importDir;
  Array<const_kj::ReadableDirectory_*> result;
  Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> lock;
  StringPtr pathRef;
  PathPtr cwd;
  pair<const_kj::StringPtr_*,_unsigned_long> importPathKey;
  DebugExpression<bool> local_209;
  Path local_208;
  Path local_1e8;
  anon_union_120_1_a8c68091_for_NullableValue<capnp::SchemaParser::DiskFileCompat>_2 *local_1d0;
  undefined1 local_1c8 [32];
  ArrayDisposer *pAStack_1a8;
  String *local_1a0;
  void *local_198;
  ArrayDisposer *local_190;
  Exception *local_188;
  Exception *local_180;
  mapped_type *local_170;
  Path *local_168;
  _Base_ptr local_160;
  undefined1 local_158 [32];
  ImportDir local_138;
  size_t local_f0;
  Exception *local_e8;
  Exception *pEStack_e0;
  void **ppvStack_d8;
  _Base_ptr local_c8;
  size_t local_c0;
  ArrayDisposer *local_b8;
  char *local_a8;
  SchemaParser *local_a0;
  Mutex *local_98;
  Maybe<capnp::SchemaParser::DiskFileCompat> *local_90;
  char local_88;
  Exception *local_80;
  Exception *pEStack_78;
  void **ppvStack_70;
  Exception *local_68;
  Exception *pEStack_60;
  PathPtr local_50;
  key_type local_40;
  
  __arg = (void *)diskPath.content.size_;
  local_f0 = displayName.content.size_;
  local_a8 = displayName.content.ptr;
  pIVar5 = (this->impl).ptr;
  pMVar2 = &pIVar5->compat;
  local_1c8._0_8_ = local_1c8._0_8_ & 0xffffffffffffff00;
  local_a0 = this;
  kj::_::Mutex::lock(&pMVar2->mutex,0);
  local_90 = &(pIVar5->compat).value;
  paVar23 = &(pIVar5->compat).value.ptr.field_1;
  local_98 = &pMVar2->mutex;
  if ((pIVar5->compat).value.ptr.isSet == false) {
    kj::newDiskFilesystem();
    (pIVar5->compat).value.ptr.field_1.value.fs = (pIVar5->compat).value.ptr.field_1.value.ownFs.ptr
    ;
    puVar3 = (undefined1 *)((long)&(pIVar5->compat).value.ptr.field_1 + 0x20);
    *(undefined4 *)((long)&(pIVar5->compat).value.ptr.field_1 + 0x20) = 0;
    *(undefined8 *)((long)&(pIVar5->compat).value.ptr.field_1 + 0x28) = 0;
    *(undefined1 **)((long)&(pIVar5->compat).value.ptr.field_1 + 0x30) = puVar3;
    *(undefined1 **)((long)&(pIVar5->compat).value.ptr.field_1 + 0x38) = puVar3;
    *(undefined8 *)((long)&(pIVar5->compat).value.ptr.field_1 + 0x40) = 0;
    puVar3 = (undefined1 *)((long)&(pIVar5->compat).value.ptr.field_1 + 0x50);
    *(undefined4 *)((long)&(pIVar5->compat).value.ptr.field_1 + 0x50) = 0;
    *(undefined8 *)((long)&(pIVar5->compat).value.ptr.field_1 + 0x58) = 0;
    *(undefined1 **)((long)&(pIVar5->compat).value.ptr.field_1 + 0x60) = puVar3;
    *(undefined1 **)((long)&(pIVar5->compat).value.ptr.field_1 + 0x68) = puVar3;
    *(undefined8 *)((long)&(pIVar5->compat).value.ptr.field_1 + 0x70) = 0;
    (pIVar5->compat).value.ptr.isSet = true;
  }
  iVar13 = (**((pIVar5->compat).value.ptr.field_1.value.fs)->_vptr_Filesystem)();
  local_168 = (Path *)CONCAT44(extraout_var,iVar13);
  iVar13 = (*((pIVar5->compat).value.ptr.field_1.value.fs)->_vptr_Filesystem[2])();
  local_50.parts.ptr = (String *)CONCAT44(extraout_var_00,iVar13);
  kj::PathPtr::eval(&local_208,&local_50,diskPath);
  if (importPath.size_ == 0) {
    sVar17 = local_f0;
    paVar23 = (anon_union_120_1_a8c68091_for_NullableValue<capnp::SchemaParser::DiskFileCompat>_2 *)
              (Maybe<kj::String> *)0x0;
    pmVar14 = (mapped_type *)(ReadableDirectory **)0x0;
  }
  else {
    local_40.first = importPath.ptr;
    local_40.second = importPath.size_;
    pmVar14 = std::
              map<std::pair<const_kj::StringPtr_*,_unsigned_long>,_kj::Array<const_kj::ReadableDirectory_*>,_std::less<std::pair<const_kj::StringPtr_*,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<const_kj::StringPtr_*,_unsigned_long>,_kj::Array<const_kj::ReadableDirectory_*>_>_>_>
              ::operator[](&(pIVar5->compat).value.ptr.field_1.value.cachedImportPaths,&local_40);
    local_1d0 = paVar23;
    if (pmVar14->size_ == 0) {
      __arg = (void *)0x0;
      local_170 = pmVar14;
      local_158._0_8_ =
           kj::_::HeapArrayDisposer::allocateImpl
                     (8,0,importPath.size_,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_158._16_8_ = &((_Base_ptr)local_158._0_8_)->_M_color + importPath.size_ * 2;
      local_158._24_8_ = &kj::_::HeapArrayDisposer::instance;
      local_158._8_8_ = local_158._0_8_;
      if (importPath.size_ != 0) {
        pmVar1 = &(local_1d0->value).cachedImportDirs;
        local_160 = (_Base_ptr)((long)local_1d0 + 0x20);
        this_00 = &(importPath.ptr)->content;
        do {
          iVar15 = std::
                   _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>,_std::_Select1st<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
                   ::find(&pmVar1->_M_t,(key_type *)this_00);
          if (iVar15._M_node == local_160) {
            kj::PathPtr::eval(&local_1e8,&local_50,(StringPtr)*this_00);
            (*(code *)(local_168->parts).ptr[3].content.disposer)
                      (local_1c8,local_168,local_1e8.parts.ptr,local_1e8.parts.size_);
            params = extraout_RDX;
            if ((Exception *)local_1c8._8_8_ == (Exception *)0x0) {
              clock = kj::nullClock();
              fileFactory = kj::defaultInMemoryFileFactory();
              OVar24 = kj::newInMemoryDirectory((kj *)local_1c8,clock,fileFactory);
              params = (StringPtr *)OVar24.ptr;
            }
            pEVar19 = (Exception *)local_1c8._8_8_;
            uVar9 = local_1c8._0_8_;
            local_68 = (Exception *)this_00->ptr;
            pEStack_60 = (Exception *)this_00->size_;
            kj::str<kj::StringPtr_const&>(&local_138.pathStr,(kj *)this_00,params);
            local_198 = (void *)local_1e8.parts.size_;
            local_1a0 = local_1e8.parts.ptr;
            local_138.path.parts.disposer = local_1e8.parts.disposer;
            local_1e8.parts.ptr = (String *)0x0;
            local_1e8.parts.size_ = 0;
            local_138.dir.disposer = (Disposer *)uVar9;
            local_1c8._0_8_ = local_68;
            local_1c8._8_8_ = pEStack_60;
            local_1c8._16_8_ = local_138.pathStr.content.ptr;
            local_1c8._24_8_ = local_138.pathStr.content.size_;
            pAStack_1a8 = local_138.pathStr.content.disposer;
            local_138.pathStr.content.ptr = (char *)0x0;
            local_138.pathStr.content.size_ = 0;
            local_190 = local_1e8.parts.disposer;
            local_138.path.parts.ptr = (String *)0x0;
            local_138.path.parts.size_ = 0;
            local_188 = (Exception *)uVar9;
            local_180 = pEVar19;
            local_138.dir.ptr = (ReadableDirectory *)0x0;
            pVar25 = std::
                     _Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>,std::_Select1st<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>>
                     ::
                     _M_emplace_unique<std::pair<kj::StringPtr,capnp::SchemaParser::DiskFileCompat::ImportDir>>
                               ((_Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>,std::_Select1st<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>>
                                 *)pmVar1,
                                (pair<kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>
                                 *)local_1c8);
            local_209.value = pVar25.second;
            DiskFileCompat::ImportDir::~ImportDir((ImportDir *)(local_1c8 + 0x10));
            DiskFileCompat::ImportDir::~ImportDir(&local_138);
            pvVar20 = (void *)local_1e8.parts.size_;
            pSVar7 = local_1e8.parts.ptr;
            if (local_209.value == false) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                        ((Fault *)local_1c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-parser.c++"
                         ,0xf6,FAILED,
                         "compat->cachedImportDirs.insert(std::make_pair(pathRef, DiskFileCompat::ImportDir { kj::str(path), kj::mv(parsed), kj::mv(dir) })).second"
                         ,"_kjCondition,",&local_209);
              kj::_::Debug::Fault::fatal((Fault *)local_1c8);
            }
            if (local_1e8.parts.ptr != (String *)0x0) {
              local_1e8.parts.ptr = (String *)0x0;
              local_1e8.parts.size_ = 0;
              (**(local_1e8.parts.disposer)->_vptr_ArrayDisposer)
                        (local_1e8.parts.disposer,pSVar7,0x18,pvVar20,pvVar20,
                         kj::ArrayDisposer::Dispose_<kj::String>::destruct);
              __arg = pvVar20;
            }
          }
          else {
            pEVar19 = (Exception *)iVar15._M_node[3]._M_parent;
          }
          *(Exception **)local_158._8_8_ = pEVar19;
          local_158._8_8_ = local_158._8_8_ + 8;
          this_00 = this_00 + 1;
        } while (this_00 != &importPath.ptr[importPath.size_].content);
      }
      pmVar14 = local_170;
      local_c0 = (long)(local_158._8_8_ - local_158._0_8_) >> 3;
      local_c8 = (_Base_ptr)local_158._0_8_;
      local_b8 = (ArrayDisposer *)local_158._24_8_;
      ppRVar6 = local_170->ptr;
      if (ppRVar6 != (ReadableDirectory **)0x0) {
        __arg = (void *)local_170->size_;
        local_170->ptr = (ReadableDirectory **)0x0;
        local_170->size_ = 0;
        (**local_170->disposer->_vptr_ArrayDisposer)(local_170->disposer,ppRVar6,8,__arg,__arg,0);
      }
      pmVar14->ptr = (ReadableDirectory **)local_c8;
      pmVar14->size_ = local_c0;
      pmVar14->disposer = local_b8;
    }
    local_170 = (mapped_type *)pmVar14->ptr;
    if (importPath.size_ == 0) {
      pp_Var22 = (_Base_ptr *)0x0;
      local_1d0 = (anon_union_120_1_a8c68091_for_NullableValue<capnp::SchemaParser::DiskFileCompat>_2
                   *)pmVar14->size_;
    }
    else {
      local_160 = (_Base_ptr)importPath.ptr;
      pmVar1 = &(local_1d0->value).cachedImportDirs;
      p_Var21 = (_Base_ptr)((long)local_1d0 + 0x20);
      lVar18 = 0;
      p_Var16 = (_Base_ptr)0x0;
      pp_Var22 = (_Base_ptr *)0x0;
      local_1d0 = (anon_union_120_1_a8c68091_for_NullableValue<capnp::SchemaParser::DiskFileCompat>_2
                   *)pmVar14->size_;
      do {
        puVar4 = (undefined8 *)((long)&local_160->_M_color + lVar18);
        local_138.pathStr.content.ptr = (char *)*puVar4;
        local_138.pathStr.content.size_ = puVar4[1];
        local_158._0_8_ =
             std::
             _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>,_std::_Select1st<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
             ::find(&pmVar1->_M_t,(key_type *)&local_138);
        local_1c8._0_8_ = local_158;
        local_1c8._16_8_ = " != ";
        local_1c8._24_8_ = &DAT_00000005;
        pAStack_1a8 = (ArrayDisposer *)
                      CONCAT71(pAStack_1a8._1_7_,(_Base_ptr)local_158._0_8_ != p_Var21);
        if ((_Base_ptr)local_158._0_8_ == p_Var21) {
          local_1c8._8_8_ = p_Var21;
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<std::_Rb_tree_iterator<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>&,std::_Rb_tree_iterator<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>>&>
                    ((Fault *)&local_1e8,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-parser.c++"
                     ,0x104,FAILED,"iter != compat->cachedImportDirs.end()","_kjCondition,",
                     (DebugComparison<std::_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_&,_std::_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
                      *)local_1c8);
          kj::_::Debug::Fault::fatal((Fault *)&local_1e8);
        }
        prefix.parts.ptr = (String *)((_Rb_tree_node_base *)(local_158._0_8_ + 0x40))->_M_parent;
        prefix.parts.size_ = (size_t)((_Rb_tree_node_base *)(local_158._0_8_ + 0x40))->_M_left;
        local_1c8._0_8_ = local_208.parts.ptr;
        local_1c8._8_8_ = local_208.parts.size_;
        bVar12 = kj::PathPtr::startsWith((PathPtr *)local_1c8,prefix);
        if (bVar12) {
          if (p_Var16 < ((_Base_ptr)(local_158._0_8_ + 0x40))->_M_left) {
            p_Var16 = ((_Base_ptr)(local_158._0_8_ + 0x40))->_M_left;
            pp_Var22 = &((_Base_ptr)(local_158._0_8_ + 0x20))->_M_left;
          }
        }
        lVar18 = lVar18 + 0x10;
      } while (importPath.size_ << 4 != lVar18);
    }
    sVar17 = local_f0;
    paVar23 = local_1d0;
    pmVar14 = local_170;
    if (pp_Var22 != (_Base_ptr *)0x0) {
      local_168 = (Path *)pp_Var22[7];
      local_138.pathStr.content.ptr =
           (char *)((void **)((long)local_208.parts.ptr + 0x68) + (long)pp_Var22[4] * 3 + -0xd);
      local_138.pathStr.content.size_ = local_208.parts.size_ - (long)pp_Var22[4];
      kj::PathPtr::clone((PathPtr *)local_1c8,(__fn *)&local_138,local_138.pathStr.content.ptr,
                         (int)local_138.pathStr.content.size_,__arg);
      sVar8 = local_208.parts.size_;
      pSVar7 = local_208.parts.ptr;
      if ((Exception *)local_208.parts.ptr != (Exception *)0x0) {
        local_208.parts.ptr = (String *)0x0;
        local_208.parts.size_ = 0;
        (**(local_208.parts.disposer)->_vptr_ArrayDisposer)
                  (local_208.parts.disposer,pSVar7,0x18,sVar8,sVar8,
                   kj::ArrayDisposer::Dispose_<kj::String>::destruct);
      }
      local_208.parts.ptr = (String *)local_1c8._0_8_;
      local_208.parts.size_ = local_1c8._8_8_;
      local_208.parts.disposer = (ArrayDisposer *)local_1c8._16_8_;
      paVar23 = local_1d0;
      pmVar14 = local_170;
    }
  }
  local_e8 = (Exception *)local_208.parts.ptr;
  pEStack_e0 = (Exception *)local_208.parts.size_;
  ppvStack_d8 = &(local_208.parts.disposer)->_vptr_ArrayDisposer;
  local_208.parts.ptr = (String *)0x0;
  local_208.parts.size_ = 0;
  sVar17 = sVar17 - 1;
  kj::heapString((String *)local_1c8,sVar17);
  if (sVar17 != 0) {
    pEVar19 = (Exception *)local_1c8._8_8_;
    if ((Exception *)local_1c8._8_8_ != (Exception *)0x0) {
      pEVar19 = (Exception *)local_1c8._0_8_;
    }
    memcpy(pEVar19,local_a8,sVar17);
  }
  local_88 = '\x01';
  local_80 = (Exception *)local_1c8._0_8_;
  pEStack_78 = (Exception *)local_1c8._8_8_;
  ppvStack_70 = (void **)local_1c8._16_8_;
  local_1c8._0_8_ = (Exception *)0x0;
  local_1c8._8_8_ = (_Base_ptr)0x0;
  importPath_00.size_ = (size_t)pmVar14;
  importPath_00.ptr = (ReadableDirectory **)&local_e8;
  SchemaFile::newFromDirectory
            ((ReadableDirectory *)&local_138,local_168,importPath_00,
             (Maybe<kj::String> *)&paVar23->value);
  PVar26 = parseFile(local_a0,(Own<capnp::SchemaFile,_std::nullptr_t> *)&local_138);
  sVar17 = local_138.pathStr.content.size_;
  if ((long *)local_138.pathStr.content.size_ != (long *)0x0) {
    local_138.pathStr.content.size_ = 0;
    (***(_func_int ***)local_138.pathStr.content.ptr)
              (local_138.pathStr.content.ptr,
               (undefined1 *)(sVar17 + *(long *)(*(long *)sVar17 + -0x10)));
  }
  pEVar11 = pEStack_78;
  pEVar19 = local_80;
  if ((local_88 == '\x01') && (local_80 != (Exception *)0x0)) {
    local_80 = (Exception *)0x0;
    pEStack_78 = (Exception *)0x0;
    (***ppvStack_70)(ppvStack_70,pEVar19,1,pEVar11,pEVar11,0);
  }
  uVar10 = local_1c8._8_8_;
  uVar9 = local_1c8._0_8_;
  if ((Exception *)local_1c8._0_8_ != (Exception *)0x0) {
    local_1c8._0_8_ = (Exception *)0x0;
    local_1c8._8_8_ = (_Base_ptr)0x0;
    (***(_func_int ***)local_1c8._16_8_)(local_1c8._16_8_,uVar9,1,uVar10,uVar10,0);
  }
  pEVar11 = pEStack_e0;
  pEVar19 = local_e8;
  if (local_e8 != (Exception *)0x0) {
    local_e8 = (Exception *)0x0;
    pEStack_e0 = (Exception *)0x0;
    (***ppvStack_d8)(ppvStack_d8,pEVar19,0x18,pEVar11,pEVar11,
                     kj::ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  sVar17 = local_208.parts.size_;
  pSVar7 = local_208.parts.ptr;
  if (local_208.parts.ptr != (String *)0x0) {
    local_208.parts.ptr = (String *)0x0;
    local_208.parts.size_ = 0;
    (**(local_208.parts.disposer)->_vptr_ArrayDisposer)
              (local_208.parts.disposer,pSVar7,0x18,sVar17,sVar17,
               kj::ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  if (local_98 != (Mutex *)0x0) {
    kj::_::Mutex::unlock(local_98,EXCLUSIVE,(Waiter *)0x0);
  }
  return PVar26;
}

Assistant:

ParsedSchema SchemaParser::parseDiskFile(
    kj::StringPtr displayName, kj::StringPtr diskPath,
    kj::ArrayPtr<const kj::StringPtr> importPath) const {
  auto lock = impl->compat.lockExclusive();
  DiskFileCompat* compat;
  KJ_IF_SOME(c, *lock) {
    compat = &c;
  } else {
    compat = &lock->emplace();
  }